

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_cstr_rchr(char *s,ssize_t i,ssize_t j,int c)

{
  size_t i_00;
  size_t sVar1;
  int in_ECX;
  char *in_RDI;
  ssize_t t;
  size_t len;
  size_t in_stack_ffffffffffffffc8;
  size_t local_20;
  size_t local_18;
  
  i_00 = strlen(in_RDI);
  if (i_00 == 0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    local_18 = IDX(i_00,in_stack_ffffffffffffffc8);
    sVar1 = IDX(i_00,in_stack_ffffffffffffffc8);
    local_20 = sVar1;
    if ((long)sVar1 < (long)local_18) {
      local_20 = local_18;
      local_18 = sVar1;
    }
  }
  while( true ) {
    if ((long)local_20 < (long)local_18) {
      return 0;
    }
    if (in_RDI[local_20] == in_ECX) break;
    local_20 = local_20 - 1;
  }
  return local_20;
}

Assistant:

size_t
zt_cstr_rchr(const char *s, ssize_t i, ssize_t j, int c) {
    zt_assert(s);

    CONVERT(s, i, j);
    for (; j >= i; j--) {
        if (s[j] == c) {
            return j;
        }
    }

    return 0;
}